

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silnia.c
# Opt level: O0

int main(void)

{
  callable_t callable;
  thread_pool_t *pool;
  future_t *future;
  undefined8 *puVar1;
  undefined8 *puVar2;
  longlong *avar;
  void *a;
  callable_t my_callable;
  arg_t *my_arg_3;
  arg_t *my_arg_2;
  arg_t *my_arg_1;
  future_t *future3;
  future_t *future2;
  future_t *future1;
  thread_pool_t *my_pool;
  longlong n;
  
  n._4_4_ = 0;
  __isoc99_scanf("%lld",&my_pool);
  pool = (thread_pool_t *)malloc(0x98);
  thread_pool_init(pool,3);
  future = (future_t *)malloc(0x40);
  malloc(0x40);
  malloc(0x40);
  puVar1 = (undefined8 *)malloc(0x10);
  *puVar1 = 1;
  puVar1[1] = my_pool;
  puVar2 = (undefined8 *)malloc(0x10);
  *puVar2 = 1;
  puVar2[1] = my_pool;
  puVar2 = (undefined8 *)malloc(0x10);
  *puVar2 = 1;
  puVar2[1] = my_pool;
  callable.arg = puVar1;
  callable.function = callable_number;
  callable.argsz = 0x10;
  async(pool,future,callable);
  puVar1 = (undefined8 *)await(future);
  printf("%lld",*puVar1);
  thread_pool_destroy(pool);
  free(pool);
  return 0;
}

Assistant:

int main() {

    long long n;
    scanf("%lld", &n);

    thread_pool_t *my_pool = malloc(sizeof(thread_pool_t));
    thread_pool_init(my_pool, 3);

    future_t *future1 = malloc(sizeof(future_t));
    future_t *future2 = malloc(sizeof(future_t));
    future_t *future3 = malloc(sizeof(future_t));

    arg_t *my_arg_1 = malloc(sizeof(arg_t));
    my_arg_1->x = 1;
    my_arg_1->limit = n;

    arg_t *my_arg_2 = malloc(sizeof(arg_t));
    my_arg_2->x = 1;
    my_arg_2->limit = n;

    arg_t *my_arg_3 = malloc(sizeof(arg_t));
    my_arg_3->x = 1;
    my_arg_3->limit = n;

    callable_t my_callable;// = malloc(sizeof(callable_t));
    my_callable.function = callable_number;
    my_callable.arg = my_arg_1;
    my_callable.argsz = sizeof(arg_t);

    async(my_pool, future1, my_callable);

    void *a = await(future1);
    long long *avar = a;
    printf("%lld", *avar);

    thread_pool_destroy(my_pool);
    free(my_pool);
    return 0;
}